

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void aura_timer_stop(aura_timer *timer)

{
  aura_eventloop *paVar1;
  
  if (timer->is_active == true) {
    paVar1 = aura_node_eventloop_get(timer->node);
    if (paVar1 == (aura_eventloop *)0x0) {
      BUG(timer->node,"Internal bug: Node has no associated eventsystem");
    }
    (*timer->module->timer_stop)(paVar1,timer);
    timer->is_active = false;
  }
  return;
}

Assistant:

void aura_timer_stop(struct aura_timer *timer)
{
	if (!timer->is_active)
		return;

	struct aura_eventloop *loop = aura_node_eventloop_get(timer->node);
	if (!loop)
		BUG(timer->node, "Internal bug: Node has no associated eventsystem");
	timer->module->timer_stop(loop, timer);
	timer->is_active = false;
}